

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * Pathie::Path::get_xdg_dir
                 (Path *__return_storage_ptr__,string *envvarname,string *defaultpath)

{
  char *pcVar1;
  string local_e0 [32];
  Path local_c0;
  undefined4 local_a0;
  allocator local_99;
  string local_98 [32];
  Pathie local_78 [48];
  char *local_48;
  char *env_value;
  string env_nstr;
  string *defaultpath_local;
  string *envvarname_local;
  
  utf8_to_filename((Pathie *)&env_value,envvarname);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = getenv(pcVar1);
  local_48 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    home();
    std::__cxx11::string::string(local_e0,(string *)defaultpath);
    join(__return_storage_ptr__,&local_c0,(string *)local_e0);
    std::__cxx11::string::~string(local_e0);
    ~Path(&local_c0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar1,&local_99);
    filename_to_utf8(local_78,(string *)local_98);
    Path(__return_storage_ptr__,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  local_a0 = 1;
  std::__cxx11::string::~string((string *)&env_value);
  return __return_storage_ptr__;
}

Assistant:

Path Path::get_xdg_dir(const std::string& envvarname, const std::string& defaultpath)
{
  std::string env_nstr = utf8_to_filename(envvarname); // environment is encoded the same as the filenames
  char* env_value = getenv(env_nstr.c_str());
  if (env_value)
    return Path(filename_to_utf8(env_value));

  return Path::home().join(defaultpath);
}